

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

bool __thiscall
CBlockPolicyEstimator::processBlockTx
          (CBlockPolicyEstimator *this,uint nBlockHeight,RemovedMempoolTransactionInfo *tx)

{
  bool bVar1;
  int blocksToConfirm_00;
  pointer this_00;
  pointer feerate;
  LogFlags in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  string_view in_stack_00000010;
  int blocksToConfirm;
  CFeeRate feeRate;
  Level in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  TxConfirmStats *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 inBlock;
  uint256 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  bool local_31;
  ConstevalFormatString<0U> fmt;
  
  inBlock = (undefined1)((uint)in_stack_ffffffffffffff84 >> 0x18);
  fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             (AnnotatedMixin<std::mutex> *)0x4f3590);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = _removeTx((CBlockPolicyEstimator *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88,(bool)inBlock);
  if (bVar1) {
    blocksToConfirm_00 = in_ESI - *(int *)(in_RDX + ZMQ);
    if (blocksToConfirm_00 < 1) {
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff68,
                   (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff68,
                   (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        LogPrintFormatInternal<>
                  (in_stack_00000010,in_stack_00000000,in_ESI,in_RDX,in_stack_000000f0,fmt);
      }
      local_31 = false;
    }
    else {
      CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffff68,
                         (CAmount *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
      std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      CFeeRate::GetFeePerK
                ((CFeeRate *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      TxConfirmStats::Record
                (in_stack_ffffffffffffff78,blocksToConfirm_00,(double)in_stack_ffffffffffffff88);
      this_00 = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                          ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      CFeeRate::GetFeePerK
                ((CFeeRate *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      TxConfirmStats::Record(this_00,blocksToConfirm_00,(double)in_stack_ffffffffffffff88);
      feerate = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                          ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      CFeeRate::GetFeePerK
                ((CFeeRate *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      TxConfirmStats::Record(this_00,blocksToConfirm_00,(double)feerate);
      local_31 = true;
    }
  }
  else {
    local_31 = false;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != fmt.fmt) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

bool CBlockPolicyEstimator::processBlockTx(unsigned int nBlockHeight, const RemovedMempoolTransactionInfo& tx)
{
    AssertLockHeld(m_cs_fee_estimator);
    if (!_removeTx(tx.info.m_tx->GetHash(), true)) {
        // This transaction wasn't being tracked for fee estimation
        return false;
    }

    // How many blocks did it take for miners to include this transaction?
    // blocksToConfirm is 1-based, so a transaction included in the earliest
    // possible block has confirmation count of 1
    int blocksToConfirm = nBlockHeight - tx.info.txHeight;
    if (blocksToConfirm <= 0) {
        // This can't happen because we don't process transactions from a block with a height
        // lower than our greatest seen height
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error Transaction had negative blocksToConfirm\n");
        return false;
    }

    // Feerates are stored and reported as BTC-per-kb:
    CFeeRate feeRate(tx.info.m_fee, tx.info.m_virtual_transaction_size);

    feeStats->Record(blocksToConfirm, static_cast<double>(feeRate.GetFeePerK()));
    shortStats->Record(blocksToConfirm, static_cast<double>(feeRate.GetFeePerK()));
    longStats->Record(blocksToConfirm, static_cast<double>(feeRate.GetFeePerK()));
    return true;
}